

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

Var Js::JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this;
  JavascriptGeneratorFunction *pJVar6;
  Var aValue;
  GeneratorVirtualScriptFunction **ppGVar7;
  JavascriptGenerator *this_00;
  GeneratorVirtualScriptFunction *this_01;
  RecyclableObject *data;
  DynamicObject *local_b0;
  undefined1 local_88 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  FunctionInfo *funcInfo;
  JavascriptGenerator *generator;
  DynamicObject *protoObject;
  Var prototype;
  JavascriptGeneratorFunction *generatorFunction;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x6b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x6d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetLibrary(pSVar3);
  pJVar6 = VarTo<Js::JavascriptGeneratorFunction,Js::RecyclableObject>(function);
  aValue = Js::JavascriptOperators::GetPropertyNoCache(function,0x124,pSVar3);
  bVar2 = VarIs<Js::DynamicObject>(aValue);
  if (bVar2) {
    local_b0 = UnsafeVarTo<Js::DynamicObject>(aValue);
  }
  else {
    local_b0 = JavascriptLibrary::GetGeneratorPrototype(this);
  }
  ppGVar7 = Memory::WriteBarrierPtr::operator_cast_to_GeneratorVirtualScriptFunction__
                      ((WriteBarrierPtr *)&pJVar6->scriptFunction);
  this_00 = JavascriptLibrary::CreateGenerator
                      (this,(Arguments *)&scriptContext,&(*ppGVar7)->super_ScriptFunction,
                       &local_b0->super_RecyclableObject);
  this_01 = Memory::WriteBarrierPtr<Js::GeneratorVirtualScriptFunction>::operator->
                      (&pJVar6->scriptFunction);
  autoReentrancyHandler._8_8_ = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)this_01);
  bVar2 = FunctionInfo::GetGeneratorWithComplexParams((FunctionInfo *)autoReentrancyHandler._8_8_);
  if ((bVar2) ||
     (bVar2 = FunctionInfo::IsModule((FunctionInfo *)autoReentrancyHandler._8_8_), bVar2)) {
    pTVar4 = ScriptContext::GetThreadContext(pSVar3);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_88,pTVar4);
    data = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
    JavascriptGenerator::CallGenerator(this_00,data,Normal);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_88);
  }
  JavascriptGenerator::SetSuspendedStart(this_00);
  return this_00;
}

Assistant:

Var JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        Assert(!(callInfo.Flags & CallFlags_New));

        auto* scriptContext = function->GetScriptContext();
        auto* library = scriptContext->GetLibrary();
        auto* generatorFunction = VarTo<JavascriptGeneratorFunction>(function);

        Var prototype = JavascriptOperators::GetPropertyNoCache(function, Js::PropertyIds::prototype, scriptContext);

        // fall back to the original prototype if we have an invalid prototype object
        DynamicObject* protoObject = VarIs<DynamicObject>(prototype) ?
            UnsafeVarTo<DynamicObject>(prototype) : library->GetGeneratorPrototype();

        JavascriptGenerator* generator = library->CreateGenerator(
            args,
            generatorFunction->scriptFunction,
            protoObject);

        // Call a next on the generator to execute till the beginning of the body
        FunctionInfo* funcInfo = generatorFunction->scriptFunction->GetFunctionInfo();
        if (funcInfo->GetGeneratorWithComplexParams() || funcInfo->IsModule())
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            generator->CallGenerator(library->GetUndefined(), ResumeYieldKind::Normal);
        }
        END_SAFE_REENTRANT_CALL

        generator->SetSuspendedStart();

        return generator;
    }